

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope_guard.hpp
# Opt level: O1

void __thiscall
scope_guard::detail::
scope_guard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/example/scope_fail_example.cpp:66:3),_scope_guard::detail::on_fail_policy>
::~scope_guard(scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]scope_guard_example_scope_fail_example_cpp:66:3),_scope_guard::detail::on_fail_policy>
               *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (this->policy_).ec_;
  if (iVar1 != -1) {
    iVar2 = std::uncaught_exceptions();
    if (iVar1 < iVar2) {
      std::fstream::close();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[2] error write file",0x14);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      std::ostream::put(-0x70);
      std::ostream::flush();
      return;
    }
  }
  return;
}

Assistant:

bool should_execute() const noexcept {
    return ec_ != -1 && ec_ < uncaught_exceptions();
  }